

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void ignore_sval_menu_display
               (menu_conflict *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  uint8_t attr_00;
  object_kind *kind_00;
  _Bool easy_know;
  void *pvVar1;
  char *str;
  uint8_t attr;
  _Bool aware;
  object_kind *kind;
  ignore_choice *choice;
  char buf [80];
  wchar_t width_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t oid_local;
  menu_conflict *menu_local;
  
  buf._76_4_ = width;
  pvVar1 = menu_priv(menu);
  kind_00 = *(object_kind **)((long)pvVar1 + (long)oid * 0x10);
  easy_know = (_Bool)(*(byte *)((long)pvVar1 + (long)oid * 0x10 + 8) & 1);
  attr_00 = curs_attrs[(int)(uint)easy_know][(int)(uint)cursor];
  object_kind_name((char *)&choice,0x50,kind_00,easy_know);
  str = format("[ ] %s",&choice);
  c_put_str(attr_00,str,row,col);
  if (((easy_know != false) && ((kind_00->ignore & 1) != 0)) ||
     ((easy_know == false && ((kind_00->ignore & 2) != 0)))) {
    c_put_str('\f',"*",row,col + L'\x01');
  }
  return;
}

Assistant:

static void ignore_sval_menu_display(struct menu *menu, int oid, bool cursor,
									 int row, int col, int width)
{
	char buf[80];
	const ignore_choice *choice = menu_priv(menu);

	struct object_kind *kind = choice[oid].kind;
	bool aware = choice[oid].aware;

	uint8_t attr = curs_attrs[(int)aware][0 != cursor];

	/* Acquire the "name" of object "i" */
	object_kind_name(buf, sizeof(buf), kind, aware);

	/* Print it */
	c_put_str(attr, format("[ ] %s", buf), row, col);
	if ((aware && (kind->ignore & IGNORE_IF_AWARE)) ||
			(!aware && (kind->ignore & IGNORE_IF_UNAWARE)))
		c_put_str(COLOUR_L_RED, "*", row, col + 1);
}